

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O1

int __thiscall
zmq::thread_ctx_t::set(thread_ctx_t *this,int option_,void *optval_,size_t optvallen_)

{
  size_t sVar1;
  int *piVar2;
  int iVar3;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar4;
  int value;
  scoped_lock_t locker_4;
  scoped_lock_t locker;
  int local_1c4;
  scoped_lock_t local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  scoped_lock_t local_198 [14];
  ios_base local_128 [264];
  
  local_1c4 = 0;
  if (optvallen_ == 4) {
    local_1c4 = *optval_;
  }
  switch(option_) {
  case 3:
    if ((optvallen_ == 4) && (-1 < local_1c4)) {
      scoped_lock_t::scoped_lock_t(local_198,&this->_opt_sync);
      this->_thread_priority = local_1c4;
LAB_00176d2a:
      scoped_lock_t::~scoped_lock_t(local_198);
      return 0;
    }
    break;
  case 4:
    if ((optvallen_ == 4) && (-1 < local_1c4)) {
      scoped_lock_t::scoped_lock_t(local_198,&this->_opt_sync);
      this->_thread_sched_policy = local_1c4;
      goto LAB_00176d2a;
    }
    break;
  case 7:
    if ((optvallen_ == 4) && (-1 < local_1c4)) {
      scoped_lock_t::scoped_lock_t(local_198,&this->_opt_sync);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->_thread_affinity_cpus,&local_1c4);
      goto LAB_00176d2a;
    }
    break;
  case 8:
    if ((optvallen_ == 4) && (-1 < local_1c4)) {
      scoped_lock_t::scoped_lock_t(local_198,&this->_opt_sync);
      pVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              equal_range(&(this->_thread_affinity_cpus)._M_t,&local_1c4);
      sVar1 = (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(&(this->_thread_affinity_cpus)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
      iVar3 = 0;
      if (sVar1 == (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        iVar3 = -1;
      }
LAB_00176e65:
      scoped_lock_t::~scoped_lock_t(local_198);
      return iVar3;
    }
    break;
  case 9:
    if (optvallen_ == 4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::ostream::operator<<((ostream *)local_198,local_1c4);
      scoped_lock_t::scoped_lock_t(&local_1c0,&this->_opt_sync);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->_thread_name_prefix,(string *)local_1b8);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      scoped_lock_t::~scoped_lock_t(&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      return 0;
    }
    if (optvallen_ - 1 < 0x10) {
      scoped_lock_t::scoped_lock_t(local_198,&this->_opt_sync);
      iVar3 = 0;
      std::__cxx11::string::_M_replace
                ((ulong)&this->_thread_name_prefix,0,
                 (char *)(this->_thread_name_prefix)._M_string_length,(ulong)optval_);
      goto LAB_00176e65;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return -1;
}

Assistant:

int zmq::thread_ctx_t::set (int option_, const void *optval_, size_t optvallen_)
{
    const bool is_int = (optvallen_ == sizeof (int));
    int value = 0;
    if (is_int)
        memcpy (&value, optval_, sizeof (int));

    switch (option_) {
        case ZMQ_THREAD_SCHED_POLICY:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_sched_policy = value;
                return 0;
            }
            break;

        case ZMQ_THREAD_AFFINITY_CPU_ADD:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_affinity_cpus.insert (value);
                return 0;
            }
            break;

        case ZMQ_THREAD_AFFINITY_CPU_REMOVE:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                if (0 == _thread_affinity_cpus.erase (value)) {
                    errno = EINVAL;
                    return -1;
                }
                return 0;
            }
            break;

        case ZMQ_THREAD_PRIORITY:
            if (is_int && value >= 0) {
                scoped_lock_t locker (_opt_sync);
                _thread_priority = value;
                return 0;
            }
            break;

        case ZMQ_THREAD_NAME_PREFIX:
            // start_thread() allows max 16 chars for thread name
            if (is_int) {
                std::ostringstream s;
                s << value;
                scoped_lock_t locker (_opt_sync);
                _thread_name_prefix = s.str ();
                return 0;
            } else if (optvallen_ > 0 && optvallen_ <= 16) {
                scoped_lock_t locker (_opt_sync);
                _thread_name_prefix.assign (static_cast<const char *> (optval_),
                                            optvallen_);
                return 0;
            }
            break;
    }

    errno = EINVAL;
    return -1;
}